

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O1

void UpdateMeshIndices(aiNode *node,uint *lookup)

{
  ulong uVar1;
  
  if (node->mNumMeshes != 0) {
    uVar1 = 0;
    do {
      node->mMeshes[uVar1] = lookup[node->mMeshes[uVar1]];
      uVar1 = uVar1 + 1;
    } while (uVar1 < node->mNumMeshes);
  }
  if (node->mNumChildren != 0) {
    uVar1 = 0;
    do {
      UpdateMeshIndices(node->mChildren[uVar1],lookup);
      uVar1 = uVar1 + 1;
    } while (uVar1 < node->mNumChildren);
  }
  return;
}

Assistant:

void UpdateMeshIndices(aiNode* node, unsigned int* lookup)
{
    for (unsigned int n = 0; n < node->mNumMeshes;++n)
        node->mMeshes[n] = lookup[node->mMeshes[n]];

    for (unsigned int n = 0; n < node->mNumChildren;++n)
        UpdateMeshIndices(node->mChildren[n],lookup);
}